

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rsgVariableValue.cpp
# Opt level: O3

void __thiscall
rsg::ValueRange::ValueRange(ValueRange *this,VariableType *type,Scalar *minVal,Scalar *maxVal)

{
  pointer pSVar1;
  int iVar2;
  pointer pSVar3;
  allocator_type local_32;
  allocator_type local_31;
  
  VariableType::VariableType(&this->m_type,type);
  iVar2 = VariableType::getScalarSize(type);
  std::vector<rsg::Scalar,_std::allocator<rsg::Scalar>_>::vector(&this->m_min,(long)iVar2,&local_31)
  ;
  iVar2 = VariableType::getScalarSize(type);
  std::vector<rsg::Scalar,_std::allocator<rsg::Scalar>_>::vector(&this->m_max,(long)iVar2,&local_32)
  ;
  pSVar1 = (this->m_min).super__Vector_base<rsg::Scalar,_std::allocator<rsg::Scalar>_>._M_impl.
           super__Vector_impl_data._M_start;
  pSVar3 = (pointer)0x0;
  if (pSVar1 != (this->m_min).super__Vector_base<rsg::Scalar,_std::allocator<rsg::Scalar>_>._M_impl.
                super__Vector_impl_data._M_finish) {
    pSVar3 = pSVar1;
  }
  iVar2 = VariableType::getScalarSize(&this->m_type);
  if (iVar2 != 0) {
    memmove(pSVar3,minVal,(long)iVar2 << 2);
  }
  pSVar1 = (this->m_max).super__Vector_base<rsg::Scalar,_std::allocator<rsg::Scalar>_>._M_impl.
           super__Vector_impl_data._M_start;
  pSVar3 = (pointer)0x0;
  if (pSVar1 != (this->m_max).super__Vector_base<rsg::Scalar,_std::allocator<rsg::Scalar>_>._M_impl.
                super__Vector_impl_data._M_finish) {
    pSVar3 = pSVar1;
  }
  iVar2 = VariableType::getScalarSize(&this->m_type);
  if (iVar2 != 0) {
    memmove(pSVar3,maxVal,(long)iVar2 << 2);
  }
  return;
}

Assistant:

ValueRange::ValueRange (const VariableType& type, const Scalar* minVal, const Scalar* maxVal)
	: m_type		(type)
	, m_min			(type.getScalarSize())
	, m_max			(type.getScalarSize())
{
	getMin() = ConstValueAccess(type, minVal).value();
	getMax() = ConstValueAccess(type, maxVal).value();
}